

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scp.c
# Opt level: O0

LIBSSH2_CHANNEL * libssh2_scp_recv(LIBSSH2_SESSION *session,char *path,stat *sb)

{
  int iVar1;
  time_t start_time;
  libssh2_struct_stat *local_d8;
  int rc;
  time_t entry_time;
  libssh2_struct_stat *sb_ptr;
  libssh2_struct_stat sb_intl;
  LIBSSH2_CHANNEL *ptr;
  stat *sb_local;
  char *path_local;
  LIBSSH2_SESSION *session_local;
  
  memset(&sb_ptr,0,0x90);
  if (sb == (stat *)0x0) {
    local_d8 = (libssh2_struct_stat *)0x0;
  }
  else {
    local_d8 = (libssh2_struct_stat *)&sb_ptr;
  }
  start_time = time((time_t *)0x0);
  do {
    sb_intl.__glibc_reserved[2] = (__syscall_slong_t)scp_recv(session,path,local_d8);
    if (((session->api_block_mode == 0) ||
        ((LIBSSH2_CHANNEL *)sb_intl.__glibc_reserved[2] != (LIBSSH2_CHANNEL *)0x0)) ||
       (iVar1 = libssh2_session_last_errno(session), iVar1 != -0x25)) break;
    iVar1 = _libssh2_wait_socket(session,start_time);
  } while (iVar1 == 0);
  if (sb != (stat *)0x0) {
    memset(sb,0,0x90);
    (sb->st_mtim).tv_sec = sb_intl.st_atim.tv_nsec;
    (sb->st_atim).tv_sec = sb_intl.st_blocks;
    sb->st_size = sb_intl.st_rdev;
    sb->st_mode = (__mode_t)sb_intl.st_nlink;
  }
  return (LIBSSH2_CHANNEL *)sb_intl.__glibc_reserved[2];
}

Assistant:

LIBSSH2_API LIBSSH2_CHANNEL *
libssh2_scp_recv(LIBSSH2_SESSION *session, const char *path, struct stat *sb)
{
    LIBSSH2_CHANNEL *ptr;

    /* scp_recv uses libssh2_struct_stat, so pass one if the caller gave us a
       struct to populate... */
    libssh2_struct_stat sb_intl;
    libssh2_struct_stat *sb_ptr;
    memset(&sb_intl, 0, sizeof(sb_intl));
    sb_ptr = sb ? &sb_intl : NULL;

    BLOCK_ADJUST_ERRNO(ptr, session, scp_recv(session, path, sb_ptr));

    /* ...and populate the caller's with as much info as fits. */
    if(sb) {
        memset(sb, 0, sizeof(struct stat));

        sb->st_mtime = sb_intl.st_mtime;
        sb->st_atime = sb_intl.st_atime;
        sb->st_size = (off_t)sb_intl.st_size;
        sb->st_mode = sb_intl.st_mode;
    }

    return ptr;
}